

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::WrapOpKill::ReplaceWithFunctionCall(WrapOpKill *this,Instruction *inst)

{
  bool bVar1;
  undefined8 insert_before;
  Op OVar2;
  Analysis preserved_analyses;
  uint32_t uVar3;
  uint32_t uVar4;
  IRContext *pIVar5;
  Instruction *pIVar6;
  Instruction *undef;
  Instruction *pIStack_70;
  uint32_t return_type_id;
  Instruction *return_inst;
  Instruction *local_50;
  Instruction *call_inst;
  undefined1 local_40 [4];
  uint32_t func_id;
  InstructionBuilder ir_builder;
  Instruction *inst_local;
  WrapOpKill *this_local;
  
  ir_builder._24_8_ = inst;
  OVar2 = Instruction::opcode(inst);
  if (OVar2 != OpKill) {
    OVar2 = Instruction::opcode((Instruction *)ir_builder._24_8_);
    bVar1 = false;
    if (OVar2 != OpTerminateInvocation) goto LAB_002a5d10;
  }
  bVar1 = true;
LAB_002a5d10:
  if (!bVar1) {
    __assert_fail("(inst->opcode() == spv::Op::OpKill || inst->opcode() == spv::Op::OpTerminateInvocation) && \"|inst| must be an OpKill or OpTerminateInvocation instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/wrap_opkill.cpp"
                  ,0x3e,"bool spvtools::opt::WrapOpKill::ReplaceWithFunctionCall(Instruction *)");
  }
  pIVar5 = Pass::context(&this->super_Pass);
  insert_before = ir_builder._24_8_;
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_40,pIVar5,(Instruction *)insert_before,preserved_analyses);
  OVar2 = Instruction::opcode((Instruction *)ir_builder._24_8_);
  call_inst._4_4_ = GetKillingFuncId(this,OVar2);
  if (call_inst._4_4_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = GetVoidTypeId(this);
    uVar4 = call_inst._4_4_;
    memset(&return_inst,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&return_inst);
    pIVar6 = InstructionBuilder::AddFunctionCall
                       ((InstructionBuilder *)local_40,uVar3,uVar4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&return_inst);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&return_inst);
    if (pIVar6 == (Instruction *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      local_50 = pIVar6;
      Instruction::UpdateDebugInfoFrom(pIVar6,(Instruction *)ir_builder._24_8_);
      uVar4 = GetOwningFunctionsReturnType(this,(Instruction *)ir_builder._24_8_);
      uVar3 = GetVoidTypeId(this);
      if (uVar4 == uVar3) {
        pIStack_70 = InstructionBuilder::AddNullaryOp((InstructionBuilder *)local_40,0,OpReturn);
      }
      else {
        pIVar6 = InstructionBuilder::AddNullaryOp((InstructionBuilder *)local_40,uVar4,OpUndef);
        if (pIVar6 == (Instruction *)0x0) {
          return false;
        }
        uVar4 = Instruction::result_id(pIVar6);
        pIStack_70 = InstructionBuilder::AddUnaryOp
                               ((InstructionBuilder *)local_40,0,OpReturnValue,uVar4);
      }
      if (pIStack_70 == (Instruction *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        pIVar5 = Pass::context(&this->super_Pass);
        IRContext::KillInst(pIVar5,(Instruction *)ir_builder._24_8_);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool WrapOpKill::ReplaceWithFunctionCall(Instruction* inst) {
  assert((inst->opcode() == spv::Op::OpKill ||
          inst->opcode() == spv::Op::OpTerminateInvocation) &&
         "|inst| must be an OpKill or OpTerminateInvocation instruction.");
  InstructionBuilder ir_builder(
      context(), inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  uint32_t func_id = GetKillingFuncId(inst->opcode());
  if (func_id == 0) {
    return false;
  }
  Instruction* call_inst =
      ir_builder.AddFunctionCall(GetVoidTypeId(), func_id, {});
  if (call_inst == nullptr) {
    return false;
  }
  call_inst->UpdateDebugInfoFrom(inst);

  Instruction* return_inst = nullptr;
  uint32_t return_type_id = GetOwningFunctionsReturnType(inst);
  if (return_type_id != GetVoidTypeId()) {
    Instruction* undef =
        ir_builder.AddNullaryOp(return_type_id, spv::Op::OpUndef);
    if (undef == nullptr) {
      return false;
    }
    return_inst =
        ir_builder.AddUnaryOp(0, spv::Op::OpReturnValue, undef->result_id());
  } else {
    return_inst = ir_builder.AddNullaryOp(0, spv::Op::OpReturn);
  }

  if (return_inst == nullptr) {
    return false;
  }

  context()->KillInst(inst);
  return true;
}